

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifest.cpp
# Opt level: O1

Node * __thiscall
llbuild::ninja::Manifest::findNode(Manifest *this,StringRef workingDirectory,StringRef path0)

{
  bool bVar1;
  int iVar2;
  SmallVectorImpl<char> *tmp;
  Node *pNVar3;
  StringRef workingDirectory_00;
  StringRef Key;
  SmallString<256U> absPathTmp;
  SmallVectorImpl<char> local_138;
  undefined1 local_128 [256];
  
  tmp = (SmallVectorImpl<char> *)path0.Data;
  local_138.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_138.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x100;
  local_138.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_128;
  llvm::SmallVectorImpl<char>::append<char_const*,void>
            (&local_138,(char *)tmp,
             (char *)((long)&(tmp->super_SmallVectorTemplateBase<char,_true>).
                             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                             BeginX + path0.Length));
  workingDirectory_00.Length = (size_t)&local_138;
  workingDirectory_00.Data = (char *)workingDirectory.Length;
  bVar1 = normalize_path((Manifest *)workingDirectory.Data,workingDirectory_00,tmp);
  if (bVar1) {
    Key.Length._0_4_ =
         local_138.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
    Key.Data = (char *)local_138.super_SmallVectorTemplateBase<char,_true>.
                       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
    Key.Length._4_4_ = 0;
    iVar2 = llvm::StringMapImpl::FindKey(&(this->nodes).super_StringMapImpl,Key);
    pNVar3 = (Node *)0x0;
    if ((iVar2 != -1) && ((long)iVar2 != (ulong)(this->nodes).super_StringMapImpl.NumBuckets)) {
      pNVar3 = (Node *)(this->nodes).super_StringMapImpl.TheTable[iVar2][1].StrLen;
    }
  }
  else {
    pNVar3 = (Node *)0x0;
  }
  if ((undefined1 *)
      local_138.super_SmallVectorTemplateBase<char,_true>.
      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX != local_128) {
    free(local_138.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  return pNVar3;
}

Assistant:

Node* Manifest::findNode(StringRef workingDirectory, StringRef path0) {
  SmallString<256> absPathTmp = path0;
  if (!normalize_path(workingDirectory, absPathTmp)) {
    return nullptr;
  }

  auto it = nodes.find(absPathTmp);
  if (it == nodes.end()) {
    return nullptr;
  }
  return it->second;
}